

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.hpp
# Opt level: O0

void __thiscall
helics::FilterInfo::FilterInfo
          (FilterInfo *this,GlobalBrokerId core_id_,InterfaceHandle handle_,string_view key_,
          string_view type_in_,string_view type_out_,bool destFilter_)

{
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_EDX;
  undefined4 in_ESI;
  allocator<char> *in_RDI;
  byte in_R9B;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_36;
  allocator<char> local_35 [19];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22;
  
  local_22._M_dataplus._M_p._1_1_ = in_R9B & 1;
  *(undefined4 *)in_RDI = in_ESI;
  *(undefined4 *)(in_RDI + 4) = in_EDX;
  __t = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8);
  this_01 = &local_22;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_01,__t,in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_01,__t,in_RDI);
  std::allocator<char>::~allocator(local_35);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_01,__t,in_RDI);
  std::allocator<char>::~allocator(&local_36);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::vector
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x5acfd4);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::vector
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x5acfe5);
  in_RDI[0x98] = (allocator<char>)(local_22._M_dataplus._M_p._1_1_ & 1);
  in_RDI[0x99] = (allocator<char>)0x0;
  *(undefined2 *)(in_RDI + 0x9a) = 0;
  std::shared_ptr<helics::FilterOperator>::shared_ptr
            ((shared_ptr<helics::FilterOperator> *)0x5ad012);
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::vector
            ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)0x5ad023);
  std::vector<helics::EptInformation,_std::allocator<helics::EptInformation>_>::vector
            ((vector<helics::EptInformation,_std::allocator<helics::EptInformation>_> *)0x5ad034);
  std::__cxx11::string::string(this_00);
  std::__cxx11::string::string(this_00);
  return;
}

Assistant:

FilterInfo(GlobalBrokerId core_id_,
               InterfaceHandle handle_,
               std::string_view key_,
               std::string_view type_in_,
               std::string_view type_out_,
               bool destFilter_):
        core_id(core_id_), handle(handle_), key(key_), inputType(type_in_), outputType(type_out_),
        dest_filter(destFilter_)
    {
    }